

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_setup_obmc_dst_bufs(MACROBLOCKD *xd,uint8_t **dst_buf1,uint8_t **dst_buf2)

{
  uint8_t *puVar1;
  
  puVar1 = xd->tmp_obmc_bufs[0];
  if ((xd->cur_buf->flags & 8) == 0) {
    *dst_buf1 = puVar1;
    dst_buf1[1] = puVar1 + 0x4000;
    dst_buf1[2] = xd->tmp_obmc_bufs[0] + 0x8000;
    puVar1 = xd->tmp_obmc_bufs[1];
    *dst_buf2 = puVar1;
    dst_buf2[1] = puVar1 + 0x4000;
    puVar1 = xd->tmp_obmc_bufs[1] + 0x8000;
  }
  else {
    *dst_buf1 = (uint8_t *)((ulong)puVar1 >> 1);
    dst_buf1[1] = (uint8_t *)((ulong)(xd->tmp_obmc_bufs[0] + 0x8000) >> 1);
    dst_buf1[2] = (uint8_t *)((ulong)(xd->tmp_obmc_bufs[0] + 0x10000) >> 1);
    *dst_buf2 = (uint8_t *)((ulong)xd->tmp_obmc_bufs[1] >> 1);
    dst_buf2[1] = (uint8_t *)((ulong)(xd->tmp_obmc_bufs[1] + 0x8000) >> 1);
    puVar1 = (uint8_t *)((ulong)(xd->tmp_obmc_bufs[1] + 0x10000) >> 1);
  }
  dst_buf2[2] = puVar1;
  return;
}

Assistant:

void av1_setup_obmc_dst_bufs(MACROBLOCKD *xd, uint8_t **dst_buf1,
                             uint8_t **dst_buf2) {
  if (is_cur_buf_hbd(xd)) {
    int len = sizeof(uint16_t);
    dst_buf1[0] = CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[0]);
    dst_buf1[1] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE * len);
    dst_buf1[2] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE * 2 * len);
    dst_buf2[0] = CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[1]);
    dst_buf2[1] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE * len);
    dst_buf2[2] =
        CONVERT_TO_BYTEPTR(xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE * 2 * len);
  } else {
    dst_buf1[0] = xd->tmp_obmc_bufs[0];
    dst_buf1[1] = xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE;
    dst_buf1[2] = xd->tmp_obmc_bufs[0] + MAX_SB_SQUARE * 2;
    dst_buf2[0] = xd->tmp_obmc_bufs[1];
    dst_buf2[1] = xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE;
    dst_buf2[2] = xd->tmp_obmc_bufs[1] + MAX_SB_SQUARE * 2;
  }
}